

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcarray.c
# Opt level: O2

LispPTR get_package_atom(char *char_base,DLword charlen,char *packname,DLword packlen,int externalp)

{
  int iVar1;
  LispPTR LVar2;
  LispPTR *pLVar3;
  undefined6 in_register_0000000a;
  uint len;
  char *packname_00;
  ulong __n;
  
  __n = CONCAT62(in_register_0000000a,packlen) & 0xffffffff;
  iVar1 = strncmp(packname,"XCL",__n);
  if (iVar1 == 0) {
    packname_00 = "XEROX-COMMON-LISP";
    len = 0x11;
  }
  else {
    iVar1 = strncmp(packname,"SI",__n);
    if (iVar1 == 0) {
      packname_00 = "SYSTEM";
      len = 6;
    }
    else {
      iVar1 = strncmp(packname,"CL",__n);
      if (iVar1 == 0) {
        packname_00 = "LISP";
        len = 4;
      }
      else {
        iVar1 = strncmp(packname,"XCLC",__n);
        if (iVar1 == 0) {
          packname_00 = "COMPILER";
          len = 8;
        }
        else {
          len = (uint)packlen;
          packname_00 = packname;
        }
      }
    }
  }
  iVar1 = find_package_from_name(packname_00,len);
  if (iVar1 < 0) {
    printf("getting package index failed %s:%s\n",packname,char_base);
    LVar2 = 0xffffffff;
  }
  else {
    LVar2 = aref1(*Package_from_Index_word,iVar1);
    pLVar3 = NativeAligned4FromLAddr(LVar2);
    LVar2 = find_symbol(char_base,0,charlen,pLVar3[9],0,0);
    if (LVar2 == 0xffffffff) {
      LVar2 = find_symbol(char_base,0,charlen,pLVar3[8],0,0);
      return LVar2;
    }
  }
  return LVar2;
}

Assistant:

LispPTR get_package_atom(const char *char_base, DLword charlen, const char *packname, DLword packlen,
                         int externalp) {
  int packindex;
  PACKAGE *packaddr;
  /* LispPTR hashtbladdr; */
  LispPTR index;

  /* For convenience, recognize the common package nicknames: */

  if (0 == strncmp(packname, "XCL", packlen))
    packindex = find_package_from_name("XEROX-COMMON-LISP", 17);
  else if (0 == strncmp(packname, "SI", packlen))
    packindex = find_package_from_name("SYSTEM", 6);
  else if (0 == strncmp(packname, "CL", packlen))
    packindex = find_package_from_name("LISP", 4);
  else if (0 == strncmp(packname, "XCLC", packlen))
    packindex = find_package_from_name("COMPILER", 8);

  /**** else if (0 == strncmp(packname, "KEYWORD", packlen))
      packindex = 7;***/

  else
    packindex = find_package_from_name(packname, packlen);

  if (packindex < 0) {
    printf("getting package index failed %s:%s\n", packname, char_base);
    return (0xffffffff);
  }

  /* if (packindex != 7)  Not necessary (Take)*/
  packaddr = (PACKAGE *)NativeAligned4FromLAddr(aref1(*Package_from_Index_word, packindex));
  /* else packaddr = (PACKAGE *)NativeAligned4FromLAddr(
                          *Keyword_Package_word);	*/
  /* hashtbladdr =	((externalp == T)?(packaddr->EXTERNAL_SYMBOLS):
                           (packaddr->INTERNAL_SYMBOLS));
   return( find_symbol(char_base, 0, charlen, hashtbladdr, 0, 0) );*/

  if ((index = find_symbol(char_base, 0, charlen, packaddr->EXTERNAL_SYMBOLS, 0, 0)) != 0xffffffff)
    return (index);
  else
    return (find_symbol(char_base, 0, charlen, packaddr->INTERNAL_SYMBOLS, 0, 0));
}